

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O0

void __thiscall
CVmObjStringBuffer::to_utf8(CVmObjStringBuffer *this,char *buf,int32_t *idx,int32_t *bytelen)

{
  int iVar1;
  vm_strbuf_ext *pvVar2;
  size_t sVar3;
  int *in_RCX;
  int *in_RDX;
  CVmObjStringBuffer *in_RDI;
  int clen;
  wchar_t c;
  utf8_ptr dst;
  int32_t actual;
  vm_strbuf_ext *ext;
  undefined4 in_stack_ffffffffffffffa8;
  wchar_t in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  undefined1 uVar4;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int32_t *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  int iVar5;
  
  pvVar2 = get_ext(in_RDI);
  adjust_args((CVmObjStringBuffer *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
              in_stack_ffffffffffffffc8,
              (int32_t *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
              (int32_t *)in_RDI);
  utf8_ptr::utf8_ptr((utf8_ptr *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                     (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  iVar5 = 0;
  while( true ) {
    uVar4 = false;
    if (iVar5 < *in_RCX) {
      uVar4 = *in_RDX < pvVar2->len;
    }
    if ((bool)uVar4 == false) break;
    sVar3 = utf8_ptr::s_wchar_size(pvVar2->buf[*in_RDX]);
    iVar1 = (int)sVar3;
    if (*in_RCX - iVar5 < iVar1) break;
    utf8_ptr::setch((utf8_ptr *)CONCAT17(uVar4,in_stack_ffffffffffffffb0),in_stack_ffffffffffffffac)
    ;
    iVar5 = iVar1 + iVar5;
    *in_RDX = *in_RDX + 1;
  }
  *in_RCX = iVar5;
  return;
}

Assistant:

void CVmObjStringBuffer::to_utf8(char *buf, int32_t &idx, int32_t &bytelen)
{
    vm_strbuf_ext *ext = get_ext();

    /* keep the index within our limits */
    adjust_args(&idx, 0, 0);

    /* we haven't copied any bytes yet */
    int32_t actual = 0;

    /* set up a utf8 pointer for the output buffer */
    utf8_ptr dst(buf);

    /* 
     *   copy characters until we reach the end of the string, or exhaust the
     *   requested number of bytes 
     */
    for (actual = 0 ; actual < bytelen && idx < (int32_t)ext->len ; ++idx)
    {
        /* get the next source character */
        wchar_t c = ext->buf[idx];
        int clen = utf8_ptr::s_wchar_size(c);
        
        /* make sure it fits in the remaining output buffer space */
        if (clen > bytelen - actual)
            break;

        /* store the character */
        dst.setch(c);

        /* count it in the output size */
        actual += clen;
    }

    /* return the actual length copied in bytelen */
    bytelen = actual;
}